

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

RsRuleSyntax * __thiscall slang::parsing::Parser::parseRsRule(Parser *this)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  ParenthesizedExpressionSyntax *expr;
  RandJoinClauseSyntax *randJoin;
  RsProdSyntax *pRVar4;
  RsCodeBlockSyntax *codeBlock;
  RsWeightClauseSyntax *weightClause;
  undefined4 extraout_var;
  RsRuleSyntax *pRVar5;
  SourceLocation SVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Token TVar7;
  Token join;
  Token openParen;
  Token closeParen;
  SourceRange SVar8;
  SourceRange SVar9;
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL> prods;
  RsProdSyntax *prod;
  SmallVectorBase<slang::syntax::RsProdSyntax_*> local_a8 [2];
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  pointer local_40;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,RandKeyword);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    join = ParserBase::expect(&this->super_ParserBase,JoinKeyword);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      openParen = ParserBase::consume(&this->super_ParserBase);
      pEVar3 = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      expr = slang::syntax::SyntaxFactory::parenthesizedExpression
                       (&this->factory,openParen,pEVar3,closeParen);
    }
    else {
      expr = (ParenthesizedExpressionSyntax *)0x0;
    }
    randJoin = slang::syntax::SyntaxFactory::randJoinClause(&this->factory,TVar7,join,expr);
  }
  else {
    randJoin = (RandJoinClauseSyntax *)0x0;
  }
  local_a8[0].len = 0;
  local_a8[0].cap = 5;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  while( true ) {
    pRVar4 = parseRsProd(this);
    local_68._0_8_ = pRVar4;
    if (pRVar4 == (RsProdSyntax *)0x0) break;
    SmallVectorBase<slang::syntax::RsProdSyntax*>::emplace_back<slang::syntax::RsProdSyntax*const&>
              ((SmallVectorBase<slang::syntax::RsProdSyntax*> *)local_a8,(RsProdSyntax **)&local_68)
    ;
    if ((randJoin != (RandJoinClauseSyntax *)0x0) && (*(SyntaxKind *)local_68._0_8_ != RsProdItem))
    {
      SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_68._0_8_);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9d0005,SVar8);
    }
  }
  if ((randJoin != (RandJoinClauseSyntax *)0x0) && (local_a8[0].len < 2)) {
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&randJoin->super_SyntaxNode);
    SVar6 = SVar8.endLoc;
    if (local_a8[0].len != 0) {
      local_68 = slang::syntax::SyntaxNode::getLastToken
                           (*(SyntaxNode **)((long)local_a8[0].data_ + (local_a8[0].len - 1) * 8));
      SVar9 = Token::range(&local_68);
      SVar6 = SVar9.endLoc;
    }
    SVar9.endLoc = SVar6;
    SVar9.startLoc = SVar8.startLoc;
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9c0005,SVar9);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,ColonEquals);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    pEVar3 = parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x20);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
    if (bVar1) {
      codeBlock = parseRsCodeBlock(this);
    }
    else {
      codeBlock = (RsCodeBlockSyntax *)0x0;
    }
    weightClause = slang::syntax::SyntaxFactory::rsWeightClause
                             (&this->factory,TVar7,pEVar3,&codeBlock->super_RsProdSyntax);
    src = extraout_RDX_00;
  }
  else {
    weightClause = (RsWeightClauseSyntax *)0x0;
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_40 = (pointer)CONCAT44(extraout_var,iVar2);
  local_68.info._0_4_ = 1;
  local_58 = (SyntaxNode *)0x0;
  pSStack_50 = (SyntaxNode *)0x0;
  local_68._0_8_ = &PTR_getChild_006245a0;
  pRVar5 = slang::syntax::SyntaxFactory::rsRule
                     (&this->factory,randJoin,(SyntaxList<slang::syntax::RsProdSyntax> *)&local_68,
                      weightClause);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pRVar5;
}

Assistant:

RsRuleSyntax& Parser::parseRsRule() {
    RandJoinClauseSyntax* randJoin = nullptr;
    if (peek(TokenKind::RandKeyword)) {
        auto rand = consume();
        auto join = expect(TokenKind::JoinKeyword);

        ParenthesizedExpressionSyntax* parenExpr = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            parenExpr = &factory.parenthesizedExpression(openParen, expr, closeParen);
        }

        randJoin = &factory.randJoinClause(rand, join, parenExpr);
    }

    SmallVector<RsProdSyntax*> prods;
    while (true) {
        auto prod = parseRsProd();
        if (!prod)
            break;

        prods.push_back(prod);
        if (randJoin && prod->kind != SyntaxKind::RsProdItem)
            addDiag(diag::RandJoinProdItem, prod->sourceRange());
    }

    if (randJoin && prods.size() < 2) {
        SourceRange range = randJoin->sourceRange();
        if (!prods.empty())
            range = SourceRange{range.start(), prods.back()->getLastToken().range().end()};

        addDiag(diag::RandJoinNotEnough, range);
    }

    RsWeightClauseSyntax* weightClause = nullptr;
    if (peek(TokenKind::ColonEquals)) {
        auto colonEqual = consume();
        auto& weight = parsePrimaryExpression(ExpressionOptions::DisallowVectors);

        RsCodeBlockSyntax* codeBlock = nullptr;
        if (peek(TokenKind::OpenBrace))
            codeBlock = &parseRsCodeBlock();

        weightClause = &factory.rsWeightClause(colonEqual, weight, codeBlock);
    }

    return factory.rsRule(randJoin, prods.copy(alloc), weightClause);
}